

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_optimizeTrainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t *parameters)

{
  uint displayLevel;
  double splitPoint;
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ZSTD_customMem customMem;
  int iVar6;
  size_t sVar7;
  uint d;
  POOL_ctx *ctx_00;
  long *__ptr;
  clock_t cVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  ulong uVar16;
  COVER_best_t best;
  COVER_ctx_t ctx;
  pthread_mutex_t local_130;
  pthread_cond_t local_108;
  long local_d8;
  void *pvStack_d0;
  size_t local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  double local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong local_90;
  COVER_ctx_t local_88;
  
  uVar16 = -(ulong)(0.0 < parameters->splitPoint);
  uVar10 = parameters->k;
  uVar12 = parameters->d;
  d = 6;
  if (uVar12 != 0) {
    d = uVar12;
  }
  uVar11 = 8;
  if (uVar12 != 0) {
    uVar11 = uVar12;
  }
  uVar12 = 0x28;
  if (parameters->steps != 0) {
    uVar12 = parameters->steps;
  }
  bVar15 = uVar10 != 0;
  uVar9 = 0x32;
  if (bVar15) {
    uVar9 = uVar10;
  }
  uVar14 = 2000;
  if (bVar15) {
    uVar14 = uVar10;
  }
  uVar10 = 0x79e;
  if (bVar15) {
    uVar10 = 0;
  }
  splitPoint = (double)(~uVar16 & 0x3ff0000000000000 | (ulong)parameters->splitPoint & uVar16);
  displayLevel = (parameters->zParams).notificationLevel;
  if (splitPoint <= 1.0) {
    if (uVar9 < uVar11 || uVar14 < uVar9) {
      uVar16 = 0xffffffffffffffd6;
      if (0 < (int)displayLevel) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_11();
      }
    }
    else if (nbSamples == 0) {
      uVar16 = 0xffffffffffffffb8;
      if (0 < g_displayLevel) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_10();
      }
    }
    else if (dictBufferCapacity < 0x100) {
      uVar16 = 0xffffffffffffffba;
      if (0 < g_displayLevel) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_9();
      }
    }
    else {
      if (parameters->nbThreads < 2) {
        ctx_00 = (POOL_ctx *)0x0;
      }
      else {
        customMem.opaque = (void *)0x0;
        customMem.customAlloc = (ZSTD_allocFunction)0x0;
        customMem.customFree = (ZSTD_freeFunction)0x0;
        ctx_00 = POOL_create_advanced((ulong)parameters->nbThreads,1,customMem);
        if (ctx_00 == (POOL_ctx *)0x0) {
          return 0xffffffffffffffc0;
        }
      }
      pthread_mutex_init(&local_130,(pthread_mutexattr_t *)0x0);
      pthread_cond_init(&local_108,(pthread_condattr_t *)0x0);
      local_d8 = 0;
      pvStack_d0 = (void *)0x0;
      local_c8 = 0;
      local_90 = 0xffffffffffffffff;
      local_c0 = 0;
      uStack_b8 = 0;
      local_b0 = 0.0;
      uStack_a8 = 0;
      local_a0 = 0;
      uStack_98 = 0;
      g_displayLevel = displayLevel - 1;
      bVar15 = g_displayLevel != 0;
      if (displayLevel == 0) {
        g_displayLevel = 0;
      }
      if (bVar15 && 0 < (int)displayLevel) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_1();
      }
      if (d <= uVar11) {
        bVar15 = true;
        do {
          if (2 < (int)displayLevel) {
            ZDICT_optimizeTrainFromBuffer_cover_cold_2();
          }
          uVar16 = COVER_ctx_init(&local_88,samplesBuffer,samplesSizes,nbSamples,d,splitPoint);
          if (0xffffffffffffff88 < uVar16) {
            if (0 < (int)displayLevel) {
              ZDICT_optimizeTrainFromBuffer_cover_cold_3();
            }
            goto LAB_0019e15c;
          }
          if (bVar15) {
            COVER_warnOnSmallCorpus(dictBufferCapacity,local_88.suffixSize,displayLevel);
          }
          uVar13 = uVar9;
          do {
            __ptr = (long *)malloc(0x48);
            if (2 < (int)displayLevel) {
              ZDICT_optimizeTrainFromBuffer_cover_cold_4();
            }
            if (__ptr == (long *)0x0) {
              if (0 < (int)displayLevel) {
                ZDICT_optimizeTrainFromBuffer_cover_cold_7();
              }
              COVER_best_destroy((COVER_best_t *)&local_130.__data);
              COVER_ctx_destroy(&local_88);
              uVar16 = 0xffffffffffffffc0;
              goto LAB_0019e3a6;
            }
            *__ptr = (long)&local_88;
            __ptr[1] = (long)&local_130;
            __ptr[2] = dictBufferCapacity;
            lVar1 = *(long *)&parameters->steps;
            dVar2 = parameters->splitPoint;
            lVar3 = *(long *)&parameters->shrinkDict;
            lVar4 = *(long *)&parameters->zParams;
            lVar5 = *(long *)&(parameters->zParams).dictID;
            __ptr[3] = *(long *)parameters;
            __ptr[4] = lVar1;
            __ptr[5] = (long)dVar2;
            __ptr[6] = lVar3;
            __ptr[7] = lVar4;
            __ptr[8] = lVar5;
            *(uint *)(__ptr + 3) = uVar13;
            *(uint *)((long)__ptr + 0x1c) = d;
            __ptr[5] = (long)splitPoint;
            *(uint *)(__ptr + 4) = uVar12;
            *(undefined4 *)(__ptr + 6) = 0;
            iVar6 = g_displayLevel;
            *(int *)((long)__ptr + 0x3c) = g_displayLevel;
            if ((dictBufferCapacity < uVar13) || (uVar13 <= d - 1)) {
              if (0 < iVar6) {
                ZDICT_optimizeTrainFromBuffer_cover_cold_6();
              }
              free(__ptr);
            }
            else {
              pthread_mutex_lock(&local_130);
              local_d8 = local_d8 + 1;
              pthread_mutex_unlock(&local_130);
              if (ctx_00 == (POOL_ctx *)0x0) {
                COVER_tryParameters(__ptr);
              }
              else {
                POOL_add(ctx_00,COVER_tryParameters,__ptr);
              }
              if ((1 < (int)displayLevel) &&
                 ((cVar8 = clock(), 150000 < cVar8 - g_time || (3 < displayLevel)))) {
                ZDICT_optimizeTrainFromBuffer_cover_cold_5();
              }
            }
            uVar13 = uVar13 + uVar10 / uVar12 + (uint)(uVar10 / uVar12 == 0);
          } while (uVar13 <= uVar14);
          COVER_best_wait((COVER_best_t *)&local_130.__data);
          COVER_ctx_destroy(&local_88);
          d = d + 2;
          bVar15 = false;
        } while (d <= uVar11);
      }
      if (1 < (int)displayLevel) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_8();
      }
      sVar7 = local_c8;
      uVar16 = local_90;
      if (local_90 < 0xffffffffffffff89) {
        (parameters->zParams).compressionLevel = (undefined4)local_a0;
        (parameters->zParams).notificationLevel = local_a0._4_4_;
        *(undefined8 *)&(parameters->zParams).dictID = uStack_98;
        parameters->splitPoint = local_b0;
        parameters->shrinkDict = (undefined4)uStack_a8;
        parameters->shrinkDictMaxRegression = uStack_a8._4_4_;
        parameters->k = (undefined4)local_c0;
        parameters->d = local_c0._4_4_;
        parameters->steps = (undefined4)uStack_b8;
        parameters->nbThreads = uStack_b8._4_4_;
        memcpy(dictBuffer,pvStack_d0,local_c8);
        uVar16 = sVar7;
      }
LAB_0019e15c:
      COVER_best_destroy((COVER_best_t *)&local_130.__data);
LAB_0019e3a6:
      POOL_free(ctx_00);
    }
  }
  else {
    uVar16 = 0xffffffffffffffd6;
    if (0 < (int)displayLevel) {
      ZDICT_optimizeTrainFromBuffer_cover_cold_12();
    }
  }
  return uVar16;
}

Assistant:

ZDICTLIB_API size_t ZDICT_optimizeTrainFromBuffer_cover(
    void* dictBuffer, size_t dictBufferCapacity, const void* samplesBuffer,
    const size_t* samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t* parameters)
{
  /* constants */
  const unsigned nbThreads = parameters->nbThreads;
  const double splitPoint =
      parameters->splitPoint <= 0.0 ? COVER_DEFAULT_SPLITPOINT : parameters->splitPoint;
  const unsigned kMinD = parameters->d == 0 ? 6 : parameters->d;
  const unsigned kMaxD = parameters->d == 0 ? 8 : parameters->d;
  const unsigned kMinK = parameters->k == 0 ? 50 : parameters->k;
  const unsigned kMaxK = parameters->k == 0 ? 2000 : parameters->k;
  const unsigned kSteps = parameters->steps == 0 ? 40 : parameters->steps;
  const unsigned kStepSize = MAX((kMaxK - kMinK) / kSteps, 1);
  const unsigned kIterations =
      (1 + (kMaxD - kMinD) / 2) * (1 + (kMaxK - kMinK) / kStepSize);
  const unsigned shrinkDict = 0;
  /* Local variables */
  const int displayLevel = parameters->zParams.notificationLevel;
  unsigned iteration = 1;
  unsigned d;
  unsigned k;
  COVER_best_t best;
  POOL_ctx *pool = NULL;
  int warned = 0;

  /* Checks */
  if (splitPoint <= 0 || splitPoint > 1) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (kMinK < kMaxD || kMaxK < kMinK) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  if (nbThreads > 1) {
    pool = POOL_create(nbThreads, 1);
    if (!pool) {
      return ERROR(memory_allocation);
    }
  }
  /* Initialization */
  COVER_best_init(&best);
  /* Turn down global display level to clean up display at level 2 and below */
  g_displayLevel = displayLevel == 0 ? 0 : displayLevel - 1;
  /* Loop through d first because each new value needs a new context */
  LOCALDISPLAYLEVEL(displayLevel, 2, "Trying %u different sets of parameters\n",
                    kIterations);
  for (d = kMinD; d <= kMaxD; d += 2) {
    /* Initialize the context for this value of d */
    COVER_ctx_t ctx;
    LOCALDISPLAYLEVEL(displayLevel, 3, "d=%u\n", d);
    {
      const size_t initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples, d, splitPoint);
      if (ZSTD_isError(initVal)) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to initialize context\n");
        COVER_best_destroy(&best);
        POOL_free(pool);
        return initVal;
      }
    }
    if (!warned) {
      COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, displayLevel);
      warned = 1;
    }
    /* Loop through k reusing the same context */
    for (k = kMinK; k <= kMaxK; k += kStepSize) {
      /* Prepare the arguments */
      COVER_tryParameters_data_t *data = (COVER_tryParameters_data_t *)malloc(
          sizeof(COVER_tryParameters_data_t));
      LOCALDISPLAYLEVEL(displayLevel, 3, "k=%u\n", k);
      if (!data) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to allocate parameters\n");
        COVER_best_destroy(&best);
        COVER_ctx_destroy(&ctx);
        POOL_free(pool);
        return ERROR(memory_allocation);
      }
      data->ctx = &ctx;
      data->best = &best;
      data->dictBufferCapacity = dictBufferCapacity;
      data->parameters = *parameters;
      data->parameters.k = k;
      data->parameters.d = d;
      data->parameters.splitPoint = splitPoint;
      data->parameters.steps = kSteps;
      data->parameters.shrinkDict = shrinkDict;
      data->parameters.zParams.notificationLevel = g_displayLevel;
      /* Check the parameters */
      if (!COVER_checkParameters(data->parameters, dictBufferCapacity)) {
        DISPLAYLEVEL(1, "Cover parameters incorrect\n");
        free(data);
        continue;
      }
      /* Call the function and pass ownership of data to it */
      COVER_best_start(&best);
      if (pool) {
        POOL_add(pool, &COVER_tryParameters, data);
      } else {
        COVER_tryParameters(data);
      }
      /* Print status */
      LOCALDISPLAYUPDATE(displayLevel, 2, "\r%u%%       ",
                         (unsigned)((iteration * 100) / kIterations));
      ++iteration;
    }
    COVER_best_wait(&best);
    COVER_ctx_destroy(&ctx);
  }
  LOCALDISPLAYLEVEL(displayLevel, 2, "\r%79s\r", "");
  /* Fill the output buffer and parameters with output of the best parameters */
  {
    const size_t dictSize = best.dictSize;
    if (ZSTD_isError(best.compressedSize)) {
      const size_t compressedSize = best.compressedSize;
      COVER_best_destroy(&best);
      POOL_free(pool);
      return compressedSize;
    }
    *parameters = best.parameters;
    memcpy(dictBuffer, best.dict, dictSize);
    COVER_best_destroy(&best);
    POOL_free(pool);
    return dictSize;
  }
}